

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::is_empty(path *p)

{
  bool bVar1;
  uintmax_t uVar2;
  path *in_stack_00000010;
  path *in_stack_00000018;
  directory_iterator *in_stack_00000020;
  directory_iterator *in_stack_ffffffffffffffa8;
  path *in_stack_ffffffffffffffb0;
  directory_iterator *this;
  element_type *in_stack_ffffffffffffffe0;
  bool local_1;
  
  bVar1 = is_directory(in_stack_ffffffffffffffb0);
  if (bVar1) {
    this = (directory_iterator *)&stack0xffffffffffffffe0;
    directory_iterator::directory_iterator(in_stack_00000020,in_stack_00000018);
    directory_iterator::directory_iterator((directory_iterator *)in_stack_ffffffffffffffe0);
    local_1 = directory_iterator::operator==(this,in_stack_ffffffffffffffa8);
    directory_iterator::~directory_iterator((directory_iterator *)0x28f2f5);
    directory_iterator::~directory_iterator((directory_iterator *)0x28f2ff);
  }
  else {
    uVar2 = file_size(in_stack_00000010);
    local_1 = uVar2 == 0;
  }
  return local_1;
}

Assistant:

GHC_INLINE bool is_empty(const path& p)
{
    if (is_directory(p)) {
        return directory_iterator(p) == directory_iterator();
    }
    else {
        return file_size(p) == 0;
    }
}